

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.cpp
# Opt level: O2

CBString * __thiscall
TreeModel::headerData
          (CBString *__return_storage_ptr__,TreeModel *this,int section,int orientation,int role)

{
  char *s;
  
  if (orientation == 1 && role == 0) {
    switch(section) {
    case 0:
      s = "Name";
      break;
    case 1:
      s = "Action";
      break;
    case 2:
      s = "Type";
      break;
    case 3:
      s = "Subtype";
      break;
    case 4:
      s = "Text";
      break;
    default:
      goto switchD_0013e6d9_default;
    }
    Bstrlib::CBString::CBString(__return_storage_ptr__,s);
  }
  else {
switchD_0013e6d9_default:
    Bstrlib::CBString::CBString(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

UString TreeModel::headerData(int section, int orientation,
                              int role) const
{
    if (orientation == 1 && role == 0) {
        switch (section)
        {
            case 0: return UString("Name");
            case 1: return UString("Action");
            case 2: return UString("Type");
            case 3: return UString("Subtype");
            case 4: return UString("Text");
        }
    }
    
    return UString();
}